

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int __thiscall
fmt::v7::
basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
::get_id<char>(basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               *this,basic_string_view<char> name)

{
  value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pvVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  basic_string_view<char> lhs;
  
  iVar3 = 0;
  if ((this->desc_ >> 0x3e & 1) != 0) {
    pvVar1 = (this->field_1).values_;
    uVar7 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < *(ulong *)((long)&pvVar1->field_0 + uVar7 + 8); uVar5 = uVar5 + 1) {
      __s = *(char **)(*(long *)((long)&pvVar1->field_0 + uVar7) + lVar6);
      sVar4 = strlen(__s);
      lhs.size_ = sVar4;
      lhs.data_ = __s;
      bVar2 = operator==(lhs,name);
      if (bVar2) {
        return *(int *)(*(long *)((long)&pvVar1->field_0 + uVar7) + 8 + lVar6);
      }
      lVar6 = lVar6 + 0x10;
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int get_id(basic_string_view<Char> name) const {
    if (!has_named_args()) return {};
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }